

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker.c
# Opt level: O0

int worker_join(worker_handle *wh)

{
  condvar_handle *condvar;
  int iVar1;
  worker_priv *priv;
  worker_handle *wh_local;
  
  condvar = (condvar_handle *)wh->priv;
  mutex_lock((mutex_handle *)(condvar + 2));
  if (2 < *(uint *)&condvar[7].priv) {
    if (*(int *)&condvar[7].priv == 5) {
      condvar_wake_all(condvar);
    }
    if (*(int *)&condvar[7].priv == 4) {
      *(undefined4 *)&condvar[7].priv = 2;
    }
    else {
      *(undefined4 *)&condvar[7].priv = 1;
    }
  }
  condvar_wake_all(condvar + 1);
  mutex_unlock((mutex_handle *)(condvar + 2));
  iVar1 = thread_join((thread_handle *)(condvar + 3));
  return iVar1;
}

Assistant:

int worker_join(struct worker_handle *wh)
{
	struct worker_priv *priv = wh->priv;

	mutex_lock(&priv->mutex);

	if (priv->state > WORKER_STOPPING_AFTER_WORK) {
		if (priv->state == WORKER_IDLE)
			condvar_wake_all(&priv->condvar);

		if (priv->state == WORKER_SIGNALED)
			priv->state = WORKER_STOPPING_AFTER_WORK;
		else
			priv->state = WORKER_STOPPING;
	}

	condvar_wake_all(&priv->condvar_idle);

	mutex_unlock(&priv->mutex);

	return thread_join(&priv->thread);
}